

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecretKey.cpp
# Opt level: O1

SecretKey * jbcoin::generateSecretKey(SecretKey *__return_storage_ptr__,KeyType type,Seed *seed)

{
  SecretKey *sk;
  result_type key;
  Slice local_58;
  string local_48;
  Slice local_28;
  
  if (type == secp256k1) {
    local_58.data_ = *(uint8_t **)(seed->buf_)._M_elems;
    local_58.size_ = *(size_t *)((seed->buf_)._M_elems + 8);
    generateRootDeterministicPrivateKey((uint256 *)&local_48,(uint128 *)&local_58);
    local_28.size_ = 0x20;
    local_28.data_ = (uint8_t *)&local_48;
    SecretKey::SecretKey(__return_storage_ptr__,&local_28);
    beast::secure_erase<void>(&local_58,0x10);
  }
  else {
    if (type != ed25519) {
      std::__cxx11::string::string
                ((string *)&local_48,"generateSecretKey: unknown key type",(allocator *)&local_58);
      LogicError(&local_48);
    }
    local_58.size_ = 0x10;
    local_58.data_ = (uint8_t *)seed;
    sha512Half_s<jbcoin::Slice>((result_type *)&local_48,&local_58);
    local_58.size_ = 0x20;
    local_58.data_ = (uint8_t *)&local_48;
    SecretKey::SecretKey(__return_storage_ptr__,&local_58);
    beast::secure_erase<void>(&local_48,0x20);
  }
  return __return_storage_ptr__;
}

Assistant:

SecretKey
generateSecretKey (KeyType type, Seed const& seed)
{
    if (type == KeyType::ed25519)
    {
        auto key = sha512Half_s(Slice(
            seed.data(), seed.size()));
        SecretKey sk = Slice{ key.data(), key.size() };
        beast::secure_erase(key.data(), key.size());
        return sk;
    }

    if (type == KeyType::secp256k1)
    {
        // FIXME: Avoid copying the seed into a uint128 key only to have
        //        generateRootDeterministicPrivateKey copy out of it.
        uint128 ps;
        std::memcpy(ps.data(),
            seed.data(), seed.size());
        auto const upk =
            generateRootDeterministicPrivateKey(ps);
        SecretKey sk = Slice{ upk.data(), upk.size() };
        beast::secure_erase(ps.data(), ps.size());
        return sk;
    }

    LogicError ("generateSecretKey: unknown key type");
}